

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O1

void highs::parallel::for_each<HEkkDual::majorUpdateFtranFinal()::__1&>
               (HighsInt start,HighsInt end,anon_class_24_3_5967739a *f,HighsInt grainSize)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  uint uVar3;
  uint32_t uVar4;
  element_type *peVar5;
  double *pdVar6;
  double *pdVar7;
  double *pdVar8;
  HighsSplitDeque *pHVar9;
  long *plVar10;
  ulong uVar11;
  int start_00;
  long lVar12;
  TaskGroup tg;
  TaskGroup local_40;
  
  if (grainSize < end - start) {
    HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
    plVar10 = (long *)__tls_get_addr(&PTR_00449ef0);
    local_40.workerDeque = (HighsSplitDeque *)*plVar10;
    local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
    do {
      pHVar9 = local_40.workerDeque;
      start_00 = start + end >> 1;
      uVar3 = ((local_40.workerDeque)->ownerData).head;
      uVar11 = (ulong)uVar3;
      if (uVar11 < 0x2000) {
        ((local_40.workerDeque)->ownerData).head = uVar3 + 1;
        ((local_40.workerDeque)->taskArray)._M_elems[uVar11].metadata.stealer.
        super___atomic_base<unsigned_long>._M_i = 0;
        *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData =
             &PTR_operator___00449520;
        *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 8) = start_00;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0xc) = end;
        *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0x10) =
             grainSize;
        *(anon_class_24_3_5967739a **)
         (((local_40.workerDeque)->taskArray)._M_elems[uVar11].taskData + 0x18) = f;
        if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
          uVar4 = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
               CONCAT44(uVar4 - 1,uVar4);
          ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
          ((local_40.workerDeque)->ownerData).splitCopy = ((local_40.workerDeque)->ownerData).head;
          ((local_40.workerDeque)->ownerData).allStolenCopy = false;
          if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
            ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
          }
          peVar5 = ((local_40.workerDeque)->ownerData).workerBunk.
                   super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          LOCK();
          _Var2._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
          (peVar5->haveJobs).super___atomic_base<int>._M_i =
               (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
          UNLOCK();
          if (_Var2._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
            HighsSplitDeque::WorkerBunk::publishWork
                      (((local_40.workerDeque)->ownerData).workerBunk.
                       super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,local_40.workerDeque);
          }
        }
        else {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
      }
      else {
        if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
           (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
          HighsSplitDeque::growShared(local_40.workerDeque);
        }
        puVar1 = &(pHVar9->ownerData).head;
        *puVar1 = *puVar1 + 1;
        for_each<HEkkDual::majorUpdateFtranFinal()::__1&>(start_00,end,f,grainSize);
      }
      end = start_00;
    } while (grainSize < start_00 - start);
    if (start < start_00) {
      pdVar6 = f->pivot;
      pdVar7 = *f->pivotArray;
      pdVar8 = *f->myRow;
      lVar12 = (long)start;
      do {
        pdVar8[lVar12] = pdVar8[lVar12] - *pdVar6 * pdVar7[lVar12];
        lVar12 = lVar12 + 1;
      } while (start_00 != lVar12);
    }
    TaskGroup::taskWait(&local_40);
    TaskGroup::~TaskGroup(&local_40);
  }
  else if (start < end) {
    pdVar6 = f->pivot;
    pdVar7 = *f->pivotArray;
    pdVar8 = *f->myRow;
    lVar12 = (long)start;
    do {
      pdVar8[lVar12] = pdVar8[lVar12] - *pdVar6 * pdVar7[lVar12];
      lVar12 = lVar12 + 1;
    } while (end != lVar12);
  }
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}